

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O2

int __thiscall StringBTree::equalKeyCompareOp(StringBTree *this,KeyType *key,uint8_t *data)

{
  char *pcVar1;
  uint8_t *puVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  uint8_t *data_local;
  
  uVar3 = key->m_length;
  pcVar4 = key->m_value;
  data_local = data;
  uVar6 = decodeBitsAndAdvance(&data_local);
  uVar5 = (uint)uVar6;
  uVar7 = uVar6 & 0xffffffff;
  if (uVar3 < uVar5) {
    uVar7 = (ulong)uVar3;
  }
  uVar8 = 0;
  while( true ) {
    if (uVar7 == uVar8) {
      if (uVar3 < uVar5) {
        return -1;
      }
      return (uint)(uVar5 < uVar3);
    }
    pcVar1 = pcVar4 + uVar8;
    puVar2 = data_local + uVar8;
    if (*pcVar1 < (char)*puVar2) break;
    uVar8 = uVar8 + 1;
    if ((char)*puVar2 < *pcVar1) {
      return 1;
    }
  }
  return -1;
}

Assistant:

int equalKeyCompareOp(const KeyType& key, const uint8_t* data) const
	{
		const auto curLength = key.length();
		const auto curValue = key.value();
		const auto otherLength = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		const auto otherValue = reinterpret_cast<const char*>(data);
		const auto minLength = std::min(key.length(), otherLength);
		
		for (auto i = 0u; i < minLength; ++i) {
			if (curValue[i] < otherValue[i])
				return -1;
			else if (curValue[i] > otherValue[i])
				return 1;
		}
		
		if (curLength < otherLength)
			return -1;
		else if (curLength > otherLength)
			return 1;

		return 0;
	}